

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O1

void __thiscall
dynamicgraph::command::CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int>::CommandVoid3
          (CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int> *this,CustomEntity *entity,
          function_t *function,string *docString)

{
  vtable_base *pvVar1;
  undefined8 uVar2;
  function_buffer *pfVar3;
  generic_list<dynamicgraph::command::Value::Type> gl;
  allocator_type local_d1;
  void *local_d0 [2];
  long local_c0;
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  local_b8;
  _Deque_iterator<dynamicgraph::command::Value::Type,_dynamicgraph::command::Value::Type_&,_dynamicgraph::command::Value::Type_*>
  local_68;
  _Deque_iterator<dynamicgraph::command::Value::Type,_dynamicgraph::command::Value::Type_&,_dynamicgraph::command::Value::Type_*>
  local_48;
  
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::_M_initialize_map(&local_b8,0);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>::
    _M_push_back_aux<dynamicgraph::command::Value::Type_const&>
              ((deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>
                *)&local_b8,(Type *)&ValueHelper<int>::TypeID);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (Type)ValueHelper<int>::TypeID;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>::
    _M_push_back_aux<dynamicgraph::command::Value::Type_const&>
              ((deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>
                *)&local_b8,(Type *)&ValueHelper<int>::TypeID);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (Type)ValueHelper<int>::TypeID;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>::
    _M_push_back_aux<dynamicgraph::command::Value::Type_const&>
              ((deque<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>
                *)&local_b8,(Type *)&ValueHelper<int>::TypeID);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (Type)ValueHelper<int>::TypeID;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_48._M_cur = local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_48._M_first = local_b8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_48._M_last = local_b8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_48._M_node = local_b8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_68._M_cur = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_68._M_first = local_b8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_68._M_last = local_b8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_68._M_node = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::vector<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>
  ::
  vector<std::_Deque_iterator<dynamicgraph::command::Value::Type,dynamicgraph::command::Value::Type&,dynamicgraph::command::Value::Type*>,void>
            ((vector<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>
              *)local_d0,&local_48,&local_68,&local_d1);
  dynamicgraph::command::Command::Command
            (&this->super_Command,&entity->super_Entity,(vector *)local_d0,(string *)docString);
  if (local_d0[0] != (void *)0x0) {
    operator_delete(local_d0[0],local_c0 - (long)local_d0[0]);
  }
  std::
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::~_Deque_base(&local_b8);
  *(undefined ***)this = &PTR__CommandVoid3_00119ab0;
  (this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>.super_function_base.
  vtable = (vtable_base *)0x0;
  pvVar1 = (function->super_function3<void,_const_int_&,_const_int_&,_const_int_&>).
           super_function_base.vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    (this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>.super_function_base.
    vtable = pvVar1;
    pfVar3 = &(function->super_function3<void,_const_int_&,_const_int_&,_const_int_&>).
              super_function_base.functor;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)(pfVar3,&(this->fptr).
                                 super_function3<void,_const_int_&,_const_int_&,_const_int_&>.
                                 super_function_base.functor,clone_functor_tag);
    }
    else {
      *(undefined8 *)
       ((long)&(this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>.
               super_function_base.functor + 0x10) =
           *(undefined8 *)
            ((long)&(function->super_function3<void,_const_int_&,_const_int_&,_const_int_&>).
                    super_function_base.functor + 0x10);
      uVar2 = *(undefined8 *)
               ((long)&(function->super_function3<void,_const_int_&,_const_int_&,_const_int_&>).
                       super_function_base.functor + 8);
      *(undefined8 *)
       &(this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>.
        super_function_base.functor = *(undefined8 *)pfVar3;
      *(undefined8 *)
       ((long)&(this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>.
               super_function_base.functor + 8) = uVar2;
    }
  }
  return;
}

Assistant:

CommandVoid3(E &entity, function_t function, const std::string &docString)
      : Command(entity,
                boost::assign::list_of(ValueHelper<T1>::TypeID)(
                    ValueHelper<T2>::TypeID)(ValueHelper<T3>::TypeID),
                docString),
        fptr(function) {}